

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_t.cpp
# Opt level: O1

void __thiscall deci::program_t::Evaluate(program_t *this,vm_t *vm,stack_t *stack,stack_t *local)

{
  double dVar1;
  opcode_t oVar2;
  pointer pcVar3;
  ulong uVar4;
  value_t *pvVar5;
  value_t *pvVar6;
  value_t *pvVar7;
  long lVar8;
  ulong uVar9;
  runtime_error *this_00;
  number_t *num;
  int iVar10;
  long lVar11;
  stack_t temp;
  stack_t local_98;
  
  lVar11 = (long)(this->source).
                 super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->source).
                 super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar11 != 0) {
    uVar9 = 0;
    do {
      pcVar3 = (this->source).super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      oVar2 = pcVar3[uVar9].opcode;
      if (0xe < (uint)oVar2) {
switchD_0010615a_caseD_d:
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Unknown Operation Code");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar5 = pcVar3[uVar9].arg;
      switch(oVar2) {
      case OP_ARG:
        uVar4 = (ulong)(double)pvVar5[1]._vptr_value_t;
        pvVar5 = stack_t::Top(stack,(long)((double)pvVar5[1]._vptr_value_t - 9.223372036854776e+18)
                                    & (long)uVar4 >> 0x3f | uVar4);
        goto LAB_0010642d;
      case OP_PUSH:
        goto LAB_0010642d;
      case OP_RESULT:
        pvVar5 = this->result;
LAB_0010642d:
        stack_t::Push(local,pvVar5);
        break;
      case OP_DROP:
        iVar10 = (int)(double)pvVar5[1]._vptr_value_t;
        goto LAB_00106369;
      case OP_CALL:
        (*this->result->_vptr_value_t[3])();
        stack_t::stack_t(&local_98);
        (*pvVar5->_vptr_value_t[7])(pvVar5,vm,local,&local_98);
        pvVar5 = stack_t::ReleaseResult(&local_98);
        stack_t::~stack_t(&local_98);
        this->result = pvVar5;
        goto LAB_0010641d;
      case OP_RETURN:
        pvVar5 = stack_t::Top(local,0);
        stack_t::Result(local,pvVar5);
        break;
      case OP_BIN:
        (*this->result->_vptr_value_t[3])();
        stack_t::stack_t(&local_98);
        (*pvVar5->_vptr_value_t[7])(pvVar5,vm,local,&local_98);
        pvVar5 = stack_t::ReleaseResult(&local_98);
        stack_t::~stack_t(&local_98);
        this->result = pvVar5;
        iVar10 = 2;
        goto LAB_0010640b;
      case OP_RVAL:
        pvVar7 = stack_t::Variable(local,pvVar5);
        pvVar6 = nothing_t::Instance();
        if (pvVar7 == pvVar6) {
          pvVar7 = stack_t::Variable(stack,pvVar5);
          pvVar5 = nothing_t::Instance();
          if (pvVar7 == pvVar5) {
            pvVar7 = nothing_t::Instance();
          }
        }
        stack_t::Push(local,pvVar7);
        uVar9 = uVar9 + 1;
        goto LAB_0010644c;
      case OP_SET:
        pvVar7 = stack_t::Top(local,0);
        stack_t::Variable(local,pvVar5,pvVar7);
        iVar10 = 1;
LAB_00106369:
        stack_t::Drop(local,iVar10);
        break;
      case OP_UNR:
        (*this->result->_vptr_value_t[3])();
        stack_t::stack_t(&local_98);
        (*pvVar5->_vptr_value_t[7])(pvVar5,vm,local,&local_98);
        pvVar5 = stack_t::ReleaseResult(&local_98);
        stack_t::~stack_t(&local_98);
        this->result = pvVar5;
        iVar10 = 1;
LAB_0010640b:
        stack_t::Drop(local,iVar10);
        stack_t::Push(local,this->result);
LAB_0010641d:
        uVar9 = uVar9 + 1;
        goto LAB_0010644c;
      case OP_JZ:
        pvVar7 = stack_t::Top(local,0);
        lVar8 = __dynamic_cast(pvVar7,&value_t::typeinfo,&number_t::typeinfo,0);
        if (lVar8 == 0) goto LAB_00106467;
        dVar1 = *(double *)(lVar8 + 0x10);
        stack_t::Drop(local,1);
        if ((dVar1 == 0.0) && (!NAN(dVar1))) goto switchD_0010615a_caseD_c;
        break;
      case OP_JMP:
switchD_0010615a_caseD_c:
        lVar8 = __dynamic_cast(pvVar5,&value_t::typeinfo,&number_t::typeinfo,0);
        if (lVar8 == 0) {
LAB_00106467:
          __cxa_bad_cast();
        }
        uVar9 = (ulong)*(double *)(lVar8 + 0x10);
        uVar9 = (long)(*(double *)(lVar8 + 0x10) - 9.223372036854776e+18) & (long)uVar9 >> 0x3f |
                uVar9;
        goto LAB_0010644c;
      case OP_LABEL:
        goto switchD_0010615a_caseD_d;
      case OP_JNZ:
        pvVar7 = stack_t::Top(local,0);
        lVar8 = __dynamic_cast(pvVar7,&value_t::typeinfo,&number_t::typeinfo,0);
        if (lVar8 == 0) goto LAB_00106467;
        dVar1 = *(double *)(lVar8 + 0x10);
        stack_t::Drop(local,1);
        if ((dVar1 != 0.0) || (NAN(dVar1))) goto switchD_0010615a_caseD_c;
      }
      uVar9 = uVar9 + 1;
LAB_0010644c:
    } while (uVar9 < (ulong)(lVar11 >> 4));
  }
  return;
}

Assistant:

void program_t::Evaluate(vm_t& vm, const stack_t& stack, stack_t& local) {
    size_t pc;
    size_t total = this->source.size();

#define NEXT_PC() ++pc; break
#define JUMP_PC(NPC) pc = NPC; break

    for (pc = 0; pc < total;) {
      auto command = this->source[pc];

      switch (command.opcode) {
      case OP_NOP:
        NEXT_PC();
      case OP_ARG:
      {
        number_t& num = *static_cast<number_t*>(command.arg);
        local.Push(stack.Top(static_cast<size_t>(num.Value())));
        NEXT_PC();
      }
      case OP_PUSH:
        local.Push(*command.arg);
        NEXT_PC();
      case OP_DROP:
      {
        number_t& num = *static_cast<number_t*>(command.arg);
        local.Drop(static_cast<int>(num.Value()));
        NEXT_PC();
      }
      case OP_CALL:
        this->result->Delete();
        this->result = EvaluateCALL(command, vm, local);
        NEXT_PC();
      case OP_RESULT:
        local.Push(*this->result);
        NEXT_PC();
      case OP_RETURN:
        local.Result(local.Top(0));
        NEXT_PC();
      case OP_BIN:
      {
        this->result->Delete();
        this->result = EvaluateCALL(command, vm, local);
        local.Drop(2);
        local.Push(*this->result);
        NEXT_PC();
      }
      case OP_RVAL:
      {
        const value_t& loc_value = local.Variable(*command.arg);       
        if (&loc_value != &nothing_t::Instance()) {
          local.Push(loc_value);
          NEXT_PC();
        }
        const value_t& glob_value = stack.Variable(*command.arg);
        if (&glob_value != &nothing_t::Instance()) {
          local.Push(glob_value);
          NEXT_PC();
        }
        local.Push(nothing_t::Instance());
        NEXT_PC();
      }
      case OP_SET:
      {
        local.Variable(*command.arg, local.Top(0));
        local.Drop(1);
        NEXT_PC();
      }
      case OP_UNR:
      {
        this->result->Delete();
        this->result = EvaluateCALL(command, vm, local);
        local.Drop(1);
        local.Push(*this->result);
        NEXT_PC();
      }
      case OP_JZ:
      {
        double topVal = dynamic_cast<number_t&>(local.Top(0)).Value();
        local.Drop(1);
        if (topVal == 0.0) {
          JUMP_PC(dynamic_cast<number_t&>(*command.arg).Value());
        }
        NEXT_PC();
      }
      case OP_JMP:
      {
        JUMP_PC(dynamic_cast<number_t&>(*command.arg).Value());
      }
      case OP_JNZ:
      {
        double topVal = dynamic_cast<number_t&>(local.Top(0)).Value();
        local.Drop(1);
        if (topVal != 0.0) {
          JUMP_PC(dynamic_cast<number_t&>(*command.arg).Value());
        }
        NEXT_PC();
      }
      default:
        throw std::runtime_error("Unknown Operation Code");
      }
    }
  }